

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyfileimpl.cpp
# Opt level: O3

void __thiscall
QNetworkReplyFileImpl::QNetworkReplyFileImpl
          (QNetworkReplyFileImpl *this,QNetworkAccessManager *manager,QNetworkRequest *req,
          Operation op)

{
  long lVar1;
  QAnyStringView newValue;
  QAnyStringView newValue_00;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar2;
  QMetaTypeInterface *pQVar3;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar4;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar5;
  undefined8 uVar6;
  char cVar7;
  int iVar8;
  QNetworkReplyFileImplPrivate *this_00;
  QObject *this_01;
  QMetaObject *pQVar9;
  undefined4 *puVar10;
  QThread *pQVar11;
  undefined8 uVar12;
  QFile *this_02;
  long in_FS_OFFSET;
  QStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QByteArrayView QVar16;
  QStringView QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QFileInfo fi;
  QUrl url;
  QHttpHeaders h;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 uVar21;
  int *piVar20;
  undefined1 *local_128;
  QObject local_120 [8];
  QObject local_118 [8];
  QObject local_110 [8];
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_108;
  QMetaTypeInterface *pQStack_100;
  char *local_f8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_e8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aStack_e0;
  QMetaTypeInterface *local_d8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_c8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aStack_c0;
  QMetaTypeInterface *local_b8;
  QNetworkRequest local_b0;
  anon_union_24_3_e3d07ef4_for_data local_a8;
  undefined8 local_90;
  undefined1 local_88 [16];
  QMetaTypeInterface *local_78;
  char *local_70;
  QMetaTypeInterface *local_68;
  InterfaceType *local_60;
  QMetaTypeInterface *local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  long local_38;
  
  uVar21 = (undefined4)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QNetworkReplyFileImplPrivate *)operator_new(0x248);
  QNetworkReplyFileImplPrivate::QNetworkReplyFileImplPrivate(this_00);
  QNetworkReply::QNetworkReply
            ((QNetworkReply *)this,(QNetworkReplyPrivate *)this_00,&manager->super_QObject);
  *(undefined ***)this = &PTR_metaObject_002cb8d8;
  QNetworkReply::setRequest((QNetworkReply *)this,req);
  QNetworkRequest::url((QNetworkRequest *)local_88);
  QNetworkReply::setUrl((QNetworkReply *)this,(QUrl *)local_88);
  QUrl::~QUrl((QUrl *)local_88);
  QNetworkReply::setOperation((QNetworkReply *)this,op);
  QIODevice::open(this,1);
  lVar1 = *(long *)(this + 8);
  *(undefined8 *)(lVar1 + 0x230) = *(undefined8 *)&manager->field_0x8;
  local_b0.d.d.ptr = (QSharedDataPointer<QNetworkRequestPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkRequest::url(&local_b0);
  QUrl::host(local_88,&local_b0,0x7f00000);
  if (local_78 == (QMetaTypeInterface *)0x9) {
    QVar13.m_data = (storage_type_conflict *)local_88._8_8_;
    QVar13.m_size = 9;
    QVar18.m_data = "localhost";
    QVar18.m_size = 9;
    cVar7 = QtPrivate::equalStrings(QVar13,QVar18);
  }
  else {
    cVar7 = '\0';
  }
  if ((PrivateShared *)local_88._0_8_ != (PrivateShared *)0x0) {
    LOCK();
    *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_88._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
    }
  }
  if (cVar7 != '\0') {
    local_88._0_8_ = (PrivateShared *)0x0;
    local_88._8_8_ = (undefined1 *)0x0;
    local_78 = (QMetaTypeInterface *)0x0;
    QUrl::setHost((QString *)&local_b0,(ParsingMode)local_88);
    if ((PrivateShared *)local_88._0_8_ != (PrivateShared *)0x0) {
      LOCK();
      *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_88._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
  }
  QUrl::host(local_88,&local_b0,0x7f00000);
  pQVar3 = local_78;
  if ((PrivateShared *)local_88._0_8_ != (PrivateShared *)0x0) {
    LOCK();
    *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_88._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
    }
  }
  if (pQVar3 == (QMetaTypeInterface *)0x0) {
    QUrl::path(local_88,&local_b0,0x7f00000);
    pQVar3 = local_78;
    if ((PrivateShared *)local_88._0_8_ != (PrivateShared *)0x0) {
      LOCK();
      *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_88._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
    if (pQVar3 == (QMetaTypeInterface *)0x0) {
      QVar16.m_data = (storage_type *)0x1;
      QVar16.m_size = (qsizetype)local_88;
      QString::fromLatin1(QVar16);
      local_a8.shared = (PrivateShared *)local_88._0_8_;
      local_a8._8_8_ = local_88._8_8_;
      local_a8._16_8_ = local_78;
      QUrl::setPath((QString *)&local_b0,(ParsingMode)&local_a8);
      if (local_a8.shared != (PrivateShared *)0x0) {
        LOCK();
        *(int *)local_a8.shared = *(int *)local_a8.shared + -1;
        UNLOCK();
        if (*(int *)local_a8.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_a8.shared,2,0x10);
        }
      }
    }
    QNetworkReply::setUrl((QNetworkReply *)this,(QUrl *)&local_b0);
    local_b8 = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.m_data = &DAT_aaaaaaaaaaaaaaaa;
    aStack_c0.m_data = &DAT_aaaaaaaaaaaaaaaa;
    QUrl::toLocalFile();
    if (local_b8 == (QMetaTypeInterface *)0x0) {
      local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QUrl::scheme();
      if (((undefined1 *)local_a8._16_8_ == (undefined1 *)0x3) &&
         (QVar17.m_data = (storage_type_conflict *)local_a8._8_8_, QVar17.m_size = 3,
         QVar19.m_data = "qrc", QVar19.m_size = 3, cVar7 = QtPrivate::equalStrings(QVar17,QVar19),
         cVar7 != '\0')) {
        QUrl::path(&local_108,&local_b0,0x7f00000);
        local_70 = local_f8;
        local_78 = pQStack_100;
        local_88._8_8_ = local_108;
        local_88._0_2_ = 0x3a;
        local_108.m_data = (int *)0x0;
        pQStack_100 = (QMetaTypeInterface *)0x0;
        local_f8 = (char *)0x0;
        QStringBuilder<char16_t,_QString>::convertTo<QString>
                  ((QString *)&local_e8,(QStringBuilder<char16_t,_QString> *)local_88);
        aVar5 = aStack_c0;
        aVar4 = local_c8;
        pQVar3 = local_d8;
        aVar2 = local_e8;
        local_e8.m_data = local_c8.m_data;
        local_c8 = aVar2;
        aStack_c0 = aStack_e0;
        aStack_e0 = aVar5;
        local_d8 = local_b8;
        local_b8 = pQVar3;
        if (aVar4.m_data != (void *)0x0) {
          LOCK();
          *(int *)aVar4.m_data = *aVar4.m_data + -1;
          UNLOCK();
          if (*aVar4.m_data == 0) {
            QArrayData::deallocate((QArrayData *)aVar4.m_data,2,0x10);
          }
        }
        if ((void *)local_88._8_8_ != (void *)0x0) {
          LOCK();
          *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_88._8_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_88._8_8_,2,0x10);
          }
        }
        if ((int *)local_108.m_data != (int *)0x0) {
          LOCK();
          *(int *)local_108.m_data = *local_108.m_data + -1;
          iVar8 = *local_108.m_data;
          UNLOCK();
          aVar2 = local_108;
joined_r0x0019731f:
          if (iVar8 == 0) {
            QArrayData::deallocate((QArrayData *)aVar2.m_data,2,0x10);
          }
        }
      }
      else {
        QUrl::toString(local_88,&local_b0,0xde);
        pQVar3 = local_78;
        uVar6 = local_88._8_8_;
        uVar12 = local_88._0_8_;
        local_78 = local_b8;
        aVar2 = aStack_c0;
        local_88._0_8_ = local_c8;
        local_c8 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)uVar12;
        aStack_c0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)local_88._8_8_;
        local_88._8_8_ = aVar2;
        local_b8 = pQVar3;
        if ((int *)local_88._0_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
          iVar8 = *(int *)local_88._0_8_;
          UNLOCK();
          aStack_c0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)uVar6;
          aVar2 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)local_88._0_8_;
          goto joined_r0x0019731f;
        }
      }
      if ((QArrayData *)local_a8.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_a8.shared = *(int *)local_a8.shared + -1;
        UNLOCK();
        if (*(int *)local_a8.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_a8.shared,2,0x10);
        }
      }
    }
    local_a8.shared = (PrivateShared *)0x0;
    local_a8._8_8_ = (undefined1 *)0x0;
    local_a8._16_8_ = (undefined1 *)0x0;
    local_90 = 2;
    QNetworkRequest::attribute
              ((QVariant *)local_88,req,BackgroundRequestAttribute,(QVariant *)&local_a8);
    cVar7 = QVariant::toBool();
    QVariant::~QVariant((QVariant *)local_88);
    QVariant::~QVariant((QVariant *)&local_a8);
    if (cVar7 == '\0') {
      QNetworkReply::setFinished((QNetworkReply *)this,true);
      local_128 = &DAT_aaaaaaaaaaaaaaaa;
      QFileInfo::QFileInfo((QFileInfo *)&local_128,(QString *)&local_c8);
      cVar7 = QFileInfo::isDir();
      if (cVar7 == '\0') {
        this_02 = (QFile *)operator_new(0x10);
        QFile::QFile(this_02,(QString *)&local_c8,(QObject *)this);
        uVar12 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this_02);
        piVar20 = *(int **)(lVar1 + 0x238);
        *(undefined8 *)(lVar1 + 0x238) = uVar12;
        *(QFile **)(lVar1 + 0x240) = this_02;
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            operator_delete(piVar20);
          }
          this_02 = *(QFile **)(lVar1 + 0x240);
        }
        cVar7 = (**(code **)(*(long *)this_02 + 0x68))(this_02,0x21);
        if (cVar7 == '\0') {
          local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QCoreApplication::translate
                    ((char *)local_88,"QNetworkAccessFileBackend","Error opening %1: %2",0);
          (**(code **)(**(long **)(lVar1 + 0x240) + 0xe8))(&local_e8);
          QIODevice::errorString();
          QString::arg<QString,QString>
                    ((type *)&local_a8,(QString *)local_88,(QString *)&local_e8,
                     (QString *)&local_108);
          if (local_108.m_data != (void *)0x0) {
            LOCK();
            *(int *)local_108.m_data = *local_108.m_data + -1;
            UNLOCK();
            if (*local_108.m_data == 0) {
              QArrayData::deallocate((QArrayData *)local_108.m_data,2,0x10);
            }
          }
          if (local_e8.m_data != (void *)0x0) {
            LOCK();
            *(int *)local_e8.m_data = *local_e8.m_data + -1;
            UNLOCK();
            if (*local_e8.m_data == 0) {
              QArrayData::deallocate((QArrayData *)local_e8.m_data,2,0x10);
            }
          }
          if ((PrivateShared *)local_88._0_8_ != (PrivateShared *)0x0) {
            LOCK();
            *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_88._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
            }
          }
          cVar7 = QFileInfo::exists();
          if (cVar7 == '\0') {
            QNetworkReply::setError((QNetworkReply *)this,ContentNotFoundError,(QString *)&local_a8)
            ;
            local_e8._0_4_ = 0xcb;
          }
          else {
            QNetworkReply::setError((QNetworkReply *)this,ContentAccessDenied,(QString *)&local_a8);
            local_e8._0_4_ = 0xc9;
          }
          local_88._0_8_ = (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0;
          local_78 = (QMetaTypeInterface *)0x0;
          local_70 = "QNetworkReply::NetworkError";
          local_68 = (QMetaTypeInterface *)0x0;
          local_60 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
          local_88._8_8_ = &local_e8;
          QMetaObject::invokeMethodImpl
                    ((QObject *)this,"errorOccurred",QueuedConnection,2,(void **)local_88,
                     (char **)&local_78,&local_68);
          local_88._0_8_ = (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0;
          local_88._8_8_ = (char *)0x0;
          local_78 = (QMetaTypeInterface *)0x0;
          QMetaObject::invokeMethodImpl
                    ((QObject *)this,"finished",QueuedConnection,1,(void **)local_88,
                     (char **)(local_88 + 8),&local_78);
          goto LAB_00197814;
        }
        local_a8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        QNetworkReply::headers((QNetworkReply *)&local_a8);
        QFileInfo::fileTime((FileTime)&local_e8);
        QNetworkHeadersPrivate::toHttpDate((QByteArray *)local_88,(QDateTime *)&local_e8);
        newValue.m_size = (size_t)local_78;
        newValue.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)local_88._8_8_;
        QHttpHeaders::replaceOrAppend((QHttpHeaders *)&local_a8.shared,LastModified,newValue);
        if ((PrivateShared *)local_88._0_8_ != (PrivateShared *)0x0) {
          LOCK();
          *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
          UNLOCK();
          if (*(int *)local_88._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
          }
        }
        QDateTime::~QDateTime((QDateTime *)&local_e8);
        iVar8 = QFileInfo::size();
        QByteArray::number((longlong)local_88,iVar8);
        newValue_00.m_size = (size_t)local_78;
        newValue_00.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)local_88._8_8_;
        QHttpHeaders::replaceOrAppend((QHttpHeaders *)&local_a8.shared,ContentLength,newValue_00);
        if ((PrivateShared *)local_88._0_8_ != (PrivateShared *)0x0) {
          LOCK();
          *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
          UNLOCK();
          if (*(int *)local_88._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
          }
        }
        QNetworkReply::setHeaders((QNetworkReply *)this,(QHttpHeaders *)&local_a8.shared);
        local_78 = (QMetaTypeInterface *)0x0;
        local_88._0_8_ = (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0;
        local_88._8_8_ = (char *)0x0;
        QMetaObject::invokeMethodImpl
                  ((QObject *)this,"metaDataChanged",QueuedConnection,1,(void **)local_88,
                   (char **)(local_88 + 8),&local_78);
        local_e8.m_data = (void *)QFileInfo::size();
        local_108.m_data = (void *)QFileInfo::size();
        local_78 = (QMetaTypeInterface *)&local_108;
        local_88._0_8_ = (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0;
        local_70 = (char *)0x0;
        local_68 = (QMetaTypeInterface *)0x25c493;
        local_60 = (InterfaceType *)0x25c493;
        local_58 = (QMetaTypeInterface *)0x0;
        local_50 = &QtPrivate::QMetaTypeInterfaceWrapper<long_long>::metaType;
        local_48 = &QtPrivate::QMetaTypeInterfaceWrapper<long_long>::metaType;
        local_88._8_8_ = &local_e8;
        QMetaObject::invokeMethodImpl
                  ((QObject *)this,"downloadProgress",QueuedConnection,3,(void **)local_88,&local_70
                   ,&local_58);
        local_78 = (QMetaTypeInterface *)0x0;
        local_88._0_8_ = (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0;
        local_88._8_8_ = (char *)0x0;
        QMetaObject::invokeMethodImpl
                  ((QObject *)this,"readyRead",QueuedConnection,1,(void **)local_88,
                   (char **)(local_88 + 8),&local_78);
        local_78 = (QMetaTypeInterface *)0x0;
        local_88._0_8_ = (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0;
        local_88._8_8_ = (char *)0x0;
        QMetaObject::invokeMethodImpl
                  ((QObject *)this,"finished",QueuedConnection,1,(void **)local_88,
                   (char **)(local_88 + 8),&local_78);
        QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&local_a8.shared);
      }
      else {
        local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_a8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QCoreApplication::translate
                  (local_88,"QNetworkAccessFileBackend","Cannot open %1: Path is a directory",0);
        QUrl::toString(&local_e8,&local_b0,0);
        QVar15.m_size = (size_t)local_88;
        QVar15.field_0.m_data = &local_a8;
        QString::arg_impl(QVar15,aStack_e0._0_4_,(QChar)(char16_t)local_d8);
        if (local_e8.m_data != (void *)0x0) {
          LOCK();
          *(int *)local_e8.m_data = *local_e8.m_data + -1;
          UNLOCK();
          if (*local_e8.m_data == 0) {
            QArrayData::deallocate((QArrayData *)local_e8.m_data,2,0x10);
          }
        }
        if ((PrivateShared *)local_88._0_8_ != (PrivateShared *)0x0) {
          LOCK();
          *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
          UNLOCK();
          if (*(int *)local_88._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        QNetworkReply::setError
                  ((QNetworkReply *)this,ContentOperationNotPermittedError,(QString *)&local_a8);
        local_e8._0_4_ = 0xca;
        local_88._0_8_ = (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0;
        local_78 = (QMetaTypeInterface *)0x0;
        local_70 = "QNetworkReply::NetworkError";
        local_68 = (QMetaTypeInterface *)0x0;
        local_60 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
        local_88._8_8_ = &local_e8;
        QMetaObject::invokeMethodImpl
                  ((QObject *)this,"errorOccurred",QueuedConnection,2,(void **)local_88,
                   (char **)&local_78,&local_68);
        local_78 = (QMetaTypeInterface *)0x0;
        local_88._0_8_ = (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0;
        local_88._8_8_ = (char *)0x0;
        QMetaObject::invokeMethodImpl
                  ((QObject *)this,"finished",QueuedConnection,1,(void **)local_88,
                   (char **)(local_88 + 8),&local_78);
LAB_00197814:
        if (local_a8.shared != (PrivateShared *)0x0) {
          LOCK();
          *(int *)local_a8.shared = *(int *)local_a8.shared + -1;
          UNLOCK();
          if (*(int *)local_a8.shared == 0) {
            QArrayData::deallocate((QArrayData *)local_a8.shared,2,0x10);
          }
        }
      }
      QFileInfo::~QFileInfo((QFileInfo *)&local_128);
    }
    else {
      this_01 = (QObject *)operator_new(0x10);
      QNetworkFile::QNetworkFile((QNetworkFile *)this_01,(QString *)&local_c8);
      local_a8.shared = (PrivateShared *)QNetworkReply::setWellKnownHeader;
      local_a8._8_8_ = 0;
      local_88._0_8_ = QNetworkFile::headerRead;
      local_88._8_8_ = (char *)0x0;
      pQVar9 = (QMetaObject *)
               QtPrivate::
               ConnectionTypes<QtPrivate::List<QHttpHeaders::WellKnownHeader,_const_QByteArray_&>,_true>
               ::types();
      puVar10 = (undefined4 *)operator_new(0x20);
      *puVar10 = 1;
      *(code **)(puVar10 + 2) =
           QtPrivate::
           QCallableObject<void_(QNetworkReply::*)(QHttpHeaders::WellKnownHeader,_QByteArrayView),_QtPrivate::List<QHttpHeaders::WellKnownHeader,_const_QByteArray_&>,_void>
           ::impl;
      *(code **)(puVar10 + 4) = QNetworkReply::setWellKnownHeader;
      *(undefined8 *)(puVar10 + 6) = 0;
      piVar20 = (int *)CONCAT44(uVar21,2);
      QObject::connectImpl
                (local_110,(void **)this_01,(QObject *)local_88,(void **)this,
                 (QSlotObjectBase *)&local_a8,(ConnectionType)puVar10,piVar20,pQVar9);
      uVar21 = (undefined4)((ulong)piVar20 >> 0x20);
      QMetaObject::Connection::~Connection((Connection *)local_110);
      local_a8.shared = (PrivateShared *)QNetworkReply::setError;
      local_a8._8_8_ = (undefined1 *)0x0;
      local_88._0_8_ = QNetworkFile::networkError;
      local_88._8_8_ = (char *)0x0;
      pQVar9 = (QMetaObject *)
               QtPrivate::
               ConnectionTypes<QtPrivate::List<QNetworkReply::NetworkError,_const_QString_&>,_true>
               ::types();
      puVar10 = (undefined4 *)operator_new(0x20);
      *puVar10 = 1;
      *(code **)(puVar10 + 2) =
           QtPrivate::
           QCallableObject<void_(QNetworkReply::*)(QNetworkReply::NetworkError,_const_QString_&),_QtPrivate::List<QNetworkReply::NetworkError,_const_QString_&>,_void>
           ::impl;
      *(code **)(puVar10 + 4) = QNetworkReply::setError;
      *(undefined8 *)(puVar10 + 6) = 0;
      QObject::connectImpl
                (local_118,(void **)this_01,(QObject *)local_88,(void **)this,
                 (QSlotObjectBase *)&local_a8,(ConnectionType)puVar10,(int *)CONCAT44(uVar21,2),
                 pQVar9);
      QMetaObject::Connection::~Connection((Connection *)local_118);
      QObject::connect(local_120,(char *)this_01,(QObject *)"2finished(bool)",(char *)this,0x25c5bc)
      ;
      QMetaObject::Connection::~Connection((Connection *)local_120);
      pQVar11 = QNetworkAccessManagerPrivate::createThread
                          (*(QNetworkAccessManagerPrivate **)(lVar1 + 0x230));
      QObject::moveToThread(this_01,pQVar11);
      local_78 = (QMetaTypeInterface *)0x0;
      local_88._0_8_ = (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0;
      local_88._8_8_ = (char *)0x0;
      QMetaObject::invokeMethodImpl
                (this_01,"open",QueuedConnection,1,(void **)local_88,(char **)(local_88 + 8),
                 &local_78);
      uVar12 = QtSharedPointer::ExternalRefCountData::getAndRef(this_01);
      piVar20 = *(int **)(lVar1 + 0x238);
      *(undefined8 *)(lVar1 + 0x238) = uVar12;
      *(QObject **)(lVar1 + 0x240) = this_01;
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 == 0) {
          operator_delete(piVar20);
        }
      }
    }
    if ((int *)local_c8.m_data == (int *)0x0) goto LAB_00197868;
    LOCK();
    *(int *)local_c8.m_data = *local_c8.m_data + -1;
    iVar8 = *local_c8.m_data;
    UNLOCK();
    uVar12 = local_c8;
  }
  else {
    local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QCoreApplication::translate
              (local_88,"QNetworkAccessFileBackend","Request for opening non-local file %1",0);
    QUrl::toString(&local_c8,&local_b0,0);
    QVar14.m_size = (size_t)local_88;
    QVar14.field_0.m_data = &local_a8;
    QString::arg_impl(QVar14,aStack_c0._0_4_,(QChar)(char16_t)local_b8);
    if ((QArrayData *)local_c8.m_data != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_c8.m_data = *local_c8.m_data + -1;
      UNLOCK();
      if (*local_c8.m_data == 0) {
        QArrayData::deallocate((QArrayData *)local_c8.m_data,2,0x10);
      }
    }
    if ((PrivateShared *)local_88._0_8_ != (PrivateShared *)0x0) {
      LOCK();
      *(int *)local_88._0_8_ = *(int *)local_88._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_88._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
    QNetworkReply::setError
              ((QNetworkReply *)this,ProtocolInvalidOperationError,(QString *)&local_a8);
    QNetworkReply::setFinished((QNetworkReply *)this,true);
    local_c8._0_4_ = 0x12e;
    local_88._0_8_ = (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0x0;
    local_78 = (QMetaTypeInterface *)0x0;
    local_70 = "QNetworkReply::NetworkError";
    local_68 = (QMetaTypeInterface *)0x0;
    local_60 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
    local_88._8_8_ = &local_c8;
    QMetaObject::invokeMethodImpl
              ((QObject *)this,"errorOccurred",QueuedConnection,2,(void **)local_88,
               (char **)&local_78,&local_68);
    local_c8.m_data = fileOpenFinished;
    aStack_c0.m_data = (undefined1 *)0x0;
    local_e8.m_data = local_e8.m_data & 0xffffffffffffff00;
    local_88._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<void>::metaType;
    local_88._8_8_ = (char *)0x0;
    local_78 = (QMetaTypeInterface *)0x0;
    QMetaObject::invokeMethodCallableHelper<void(QNetworkReplyFileImpl::*)(bool),bool>
              ((ContextType *)this,(offset_in_QNetworkReplyFileImpl_to_subr *)&local_c8,
               QueuedConnection,(QMetaMethodReturnArgument *)local_88,(bool *)&local_e8);
    if (local_a8.shared == (PrivateShared *)0x0) goto LAB_00197868;
    LOCK();
    *(int *)local_a8.shared = *(int *)local_a8.shared + -1;
    iVar8 = *(int *)local_a8.shared;
    UNLOCK();
    uVar12 = local_a8.shared;
  }
  if (iVar8 == 0) {
    QArrayData::deallocate((QArrayData *)uVar12,2,0x10);
  }
LAB_00197868:
  QUrl::~QUrl((QUrl *)&local_b0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QNetworkReplyFileImpl::QNetworkReplyFileImpl(QNetworkAccessManager *manager, const QNetworkRequest &req, const QNetworkAccessManager::Operation op)
    : QNetworkReply(*new QNetworkReplyFileImplPrivate(), manager)
{
    setRequest(req);
    setUrl(req.url());
    setOperation(op);
    QNetworkReply::open(QIODevice::ReadOnly);

    QNetworkReplyFileImplPrivate *d = (QNetworkReplyFileImplPrivate*) d_func();

    d->managerPrivate = manager->d_func();

    QUrl url = req.url();
    if (url.host() == "localhost"_L1)
        url.setHost(QString());

#if !defined(Q_OS_WIN)
    // do not allow UNC paths on Unix
    if (!url.host().isEmpty()) {
        // we handle only local files
        QString msg = QCoreApplication::translate("QNetworkAccessFileBackend", "Request for opening non-local file %1").arg(url.toString());
        setError(QNetworkReply::ProtocolInvalidOperationError, msg);
        setFinished(true); // We're finished, will emit finished() after ctor is done.
        QMetaObject::invokeMethod(this, "errorOccurred", Qt::QueuedConnection,
            Q_ARG(QNetworkReply::NetworkError, QNetworkReply::ProtocolInvalidOperationError));
        QMetaObject::invokeMethod(this, &QNetworkReplyFileImpl::fileOpenFinished, Qt::QueuedConnection, false);
        return;
    }
#endif
    if (url.path().isEmpty())
        url.setPath("/"_L1);
    setUrl(url);

    QString fileName = url.toLocalFile();
    if (fileName.isEmpty()) {
        const QString scheme = url.scheme();
        if (scheme == "qrc"_L1) {
            fileName = u':' + url.path();
        } else {
#if defined(Q_OS_ANDROID)
            if (scheme == "assets"_L1)
                fileName = "assets:"_L1 + url.path();
            else
#endif
                fileName = url.toString(QUrl::RemoveAuthority | QUrl::RemoveFragment | QUrl::RemoveQuery);
        }
    }

    if (req.attribute(QNetworkRequest::BackgroundRequestAttribute).toBool()) { // Asynchronous open
        auto realFile = new QNetworkFile(fileName);
        connect(realFile, &QNetworkFile::headerRead, this, &QNetworkReplyFileImpl::setWellKnownHeader,
                Qt::QueuedConnection);
        connect(realFile, &QNetworkFile::networkError, this, &QNetworkReplyFileImpl::setError,
                Qt::QueuedConnection);
        connect(realFile, SIGNAL(finished(bool)), SLOT(fileOpenFinished(bool)),
                Qt::QueuedConnection);

        realFile->moveToThread(d->managerPrivate->createThread());
        QMetaObject::invokeMethod(realFile, "open", Qt::QueuedConnection);

        d->realFile = realFile;
    } else { // Synch open
        setFinished(true);

        QFileInfo fi(fileName);
        if (fi.isDir()) {
            QString msg = QCoreApplication::translate("QNetworkAccessFileBackend", "Cannot open %1: Path is a directory").arg(url.toString());
            setError(QNetworkReply::ContentOperationNotPermittedError, msg);
            QMetaObject::invokeMethod(this, "errorOccurred", Qt::QueuedConnection,
                Q_ARG(QNetworkReply::NetworkError, QNetworkReply::ContentOperationNotPermittedError));
            QMetaObject::invokeMethod(this, "finished", Qt::QueuedConnection);
            return;
        }
        d->realFile = new QFile(fileName, this);
        bool opened = d->realFile->open(QIODevice::ReadOnly | QIODevice::Unbuffered);

        // could we open the file?
        if (!opened) {
            QString msg = QCoreApplication::translate("QNetworkAccessFileBackend", "Error opening %1: %2")
                    .arg(d->realFile->fileName(), d->realFile->errorString());

            if (fi.exists()) {
                setError(QNetworkReply::ContentAccessDenied, msg);
                QMetaObject::invokeMethod(this, "errorOccurred", Qt::QueuedConnection,
                    Q_ARG(QNetworkReply::NetworkError, QNetworkReply::ContentAccessDenied));
            } else {
                setError(QNetworkReply::ContentNotFoundError, msg);
                QMetaObject::invokeMethod(this, "errorOccurred", Qt::QueuedConnection,
                    Q_ARG(QNetworkReply::NetworkError, QNetworkReply::ContentNotFoundError));
            }
            QMetaObject::invokeMethod(this, "finished", Qt::QueuedConnection);
            return;
        }
        auto h = headers();
        h.replaceOrAppend(QHttpHeaders::WellKnownHeader::LastModified,
                          QNetworkHeadersPrivate::toHttpDate(fi.lastModified()));
        h.replaceOrAppend(QHttpHeaders::WellKnownHeader::ContentLength,
                          QByteArray::number(fi.size()));
        setHeaders(std::move(h));

        QMetaObject::invokeMethod(this, "metaDataChanged", Qt::QueuedConnection);
        QMetaObject::invokeMethod(this, "downloadProgress", Qt::QueuedConnection,
            Q_ARG(qint64, fi.size()), Q_ARG(qint64, fi.size()));
        QMetaObject::invokeMethod(this, "readyRead", Qt::QueuedConnection);
        QMetaObject::invokeMethod(this, "finished", Qt::QueuedConnection);
    }
}